

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  uint32 tag;
  size_t __n;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  
  __n = s->_M_string_length;
  if ((long)__n < 0x80) {
    puVar5 = this->end_;
    tag = num * 8;
    iVar2 = TagSize(tag);
    if ((long)__n <= (long)(puVar5 + ~(ulong)(ptr + iVar2) + 0x10)) {
      if (tag < 0x80) {
        *ptr = (byte)tag | 2;
        puVar5 = ptr + 1;
      }
      else {
        *ptr = (byte)tag | 0x82;
        if (tag < 0x4000) {
          ptr[1] = (uint8)(tag >> 7);
          puVar5 = ptr + 2;
        }
        else {
          puVar5 = ptr + 2;
          uVar3 = tag >> 7;
          do {
            puVar6 = puVar5;
            puVar6[-1] = (byte)uVar3 | 0x80;
            uVar4 = uVar3 >> 7;
            puVar5 = puVar6 + 1;
            bVar1 = 0x3fff < uVar3;
            uVar3 = uVar4;
          } while (bVar1);
          *puVar6 = (uint8)uVar4;
        }
      }
      *puVar5 = (uint8)__n;
      memcpy(puVar5 + 1,(s->_M_dataplus)._M_p,__n);
      return puVar5 + __n + 1;
    }
  }
  puVar5 = WriteStringMaybeAliasedOutline(this,num,s,ptr);
  return puVar5;
}

Assistant:

uint8* WriteStringMaybeAliased(uint32 num, const std::string& s, uint8* ptr) {
    std::ptrdiff_t size = s.size();
    if (PROTOBUF_PREDICT_FALSE(
            size >= 128 || end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }